

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shk.c
# Opt level: O0

void shopdig(int fall)

{
  obj *poVar1;
  boolean bVar2;
  int iVar3;
  monst *mtmp;
  char *pcVar4;
  char *pcVar5;
  obj *obj2;
  obj *obj;
  char *grabs;
  int lang;
  monst *shkp;
  int fall_local;
  
  mtmp = shop_keeper(level,u.ushops[0]);
  obj = (obj *)anon_var_dwarf_9ce80;
  if (mtmp != (monst *)0x0) {
    grabs._4_4_ = 0;
    if ((((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0) &&
        ((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0)) && (mtmp->data->msound != '\0')) {
      if (mtmp->data->msound < 0xe) {
        grabs._4_4_ = 1;
      }
      else if (0x13 < mtmp->data->msound) {
        grabs._4_4_ = 2;
      }
    }
    iVar3 = inhishop(mtmp);
    if (iVar3 == 0) {
      if (urole.malenum == 0x15f) {
        pline("You feel like a common thief.");
        iVar3 = sgn((int)u.ualign.type);
        adjalign(-iVar3);
      }
    }
    else if (fall == 0) {
      if (grabs._4_4_ == 2) {
        if (u.utraptype == 1) {
          pcVar5 = "sir";
          if (flags.female != '\0') {
            pcVar5 = "madam";
          }
          verbalize("Be careful, %s, or you might fall through the floor.",pcVar5);
        }
        else {
          pcVar5 = "Sir";
          if (flags.female != '\0') {
            pcVar5 = "Madam";
          }
          verbalize("%s, do not damage the floor here!",pcVar5);
        }
      }
      if (urole.malenum == 0x15f) {
        pline("You feel like a common thief.");
        iVar3 = sgn((int)u.ualign.type);
        adjalign(-iVar3);
      }
    }
    else {
      bVar2 = um_dist(mtmp->mx,mtmp->my,'\x05');
      if (((bVar2 == '\0') && ((*(uint *)&mtmp->field_0x60 >> 0x13 & 1) == 0)) &&
         (((*(uint *)&mtmp->field_0x60 >> 0x12 & 1) != 0 &&
          ((*(short *)((long)&mtmp[0x1b].misc_worn_check + 2) != 0 ||
           (*(int *)&mtmp[0x1b].field_0x60 != 0)))))) {
        if ((mtmp->data->mflags1 & 0x6000) == 0x6000) {
          obj = (obj *)anon_var_dwarf_9ceec;
        }
        iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
        if (iVar3 < 3) {
          pcVar5 = shkname(mtmp);
          pline("%s %s your backpack!",pcVar5,obj);
        }
        else {
          mnexto(mtmp);
          iVar3 = dist2((int)mtmp->mx,(int)mtmp->my,(int)u.ux,(int)u.uy);
          if (2 < iVar3) {
            if (grabs._4_4_ == 2) {
              pcVar5 = shkname(mtmp);
              pline("%s curses you in anger and frustration!",pcVar5);
            }
            rile_shk(mtmp);
            return;
          }
          pcVar5 = shkname(mtmp);
          pcVar4 = locomotion(mtmp->data,"leap");
          pcVar4 = makeplural(pcVar4);
          pline("%s %s, and %s your backpack!",pcVar5,pcVar4,obj);
        }
        obj2 = invent;
        poVar1 = obj2;
        while (obj2 = poVar1, obj2 != (obj *)0x0) {
          poVar1 = obj2->nobj;
          if (((((obj2->owornmask & 0xfffff9ffU) == 0) &&
               ((obj2 != uswapwep || (u.twoweap == '\0')))) &&
              ((obj2->otyp != 0xf1 || (obj2->corpsenm == 0)))) && (obj2 != current_wand)) {
            setnotworn(obj2);
            freeinv(obj2);
            subfrombill(obj2,mtmp);
            add_to_minv(mtmp,obj2);
          }
        }
      }
    }
  }
  return;
}

Assistant:

void shopdig(int fall)
{
    struct monst *shkp = shop_keeper(level, *u.ushops);
    int lang;
    const char *grabs = "grabs";

    if (!shkp) return;

    /* 0 == can't speak, 1 == makes animal noises, 2 == speaks */
    lang = 0;
    if (shkp->msleeping || !shkp->mcanmove || is_silent(shkp->data))
	;	/* lang stays 0 */
    else if (shkp->data->msound <= MS_ANIMAL)
	lang = 1;
    else if (shkp->data->msound >= MS_HUMANOID)
	lang = 2;

    if (!inhishop(shkp)) {
	if (Role_if (PM_KNIGHT)) {
	    pline("You feel like a common thief.");
	    adjalign(-sgn(u.ualign.type));
	}
	return;
    }

    if (!fall) {
	if (lang == 2) {
	    if (u.utraptype == TT_PIT)
		verbalize(
			"Be careful, %s, or you might fall through the floor.",
			flags.female ? "madam" : "sir");
	    else
		verbalize("%s, do not damage the floor here!",
			flags.female ? "Madam" : "Sir");
	}
	if (Role_if (PM_KNIGHT)) {
	    pline("You feel like a common thief.");
	    adjalign(-sgn(u.ualign.type));
	}
    } else if (!um_dist(shkp->mx, shkp->my, 5) &&
		!shkp->msleeping && shkp->mcanmove &&
		(ESHK(shkp)->billct || ESHK(shkp)->debit)) {
	    struct obj *obj, *obj2;
	    if (nolimbs(shkp->data)) {
		grabs = "knocks off";
	    }
	    if (distu(shkp->mx, shkp->my) > 2) {
		mnexto(shkp);
		/* for some reason the shopkeeper can't come next to you */
		if (distu(shkp->mx, shkp->my) > 2) {
		    if (lang == 2)
			pline("%s curses you in anger and frustration!",
			      shkname(shkp));
		    rile_shk(shkp);
		    return;
		} else
		    pline("%s %s, and %s your backpack!",
			  shkname(shkp),
			  makeplural(locomotion(shkp->data,"leap")), grabs);
	    } else
		pline("%s %s your backpack!", shkname(shkp), grabs);

	    for (obj = invent; obj; obj = obj2) {
		obj2 = obj->nobj;
		if ((obj->owornmask & ~(W_SWAPWEP|W_QUIVER)) != 0 ||
			(obj == uswapwep && u.twoweap) ||
			(obj->otyp == LEASH && obj->leashmon)) continue;
		if (obj == current_wand) continue;
		setnotworn(obj);
		freeinv(obj);
		subfrombill(obj, shkp);
		add_to_minv(shkp, obj);	/* may free obj */
	    }
    }
}